

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_boxtype.cxx
# Opt level: O3

void __thiscall Fl_Widget::draw_backdrop(Fl_Widget *this)

{
  int iVar1;
  undefined8 in_RAX;
  Fl_Image *pFVar2;
  uint uVar3;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  if ((((this->label_).align_ & 0x200) != 0) &&
     (pFVar2 = (this->label_).image, pFVar2 != (Fl_Image *)0x0)) {
    if (((this->label_).deimage != (Fl_Image *)0x0) &&
       ((iVar1 = active_r(this), iVar1 == 0 &&
        (pFVar2 = (this->label_).deimage, pFVar2 == (Fl_Image *)0x0)))) {
      return;
    }
    (*pFVar2->_vptr_Fl_Image[7])
              (pFVar2,(ulong)(uint)((this->w_ - pFVar2->w_) / 2 + this->x_),
               (ulong)(uint)((this->h_ - pFVar2->h_) / 2 + this->y_),(ulong)(uint)pFVar2->w_,
               (ulong)(uint)pFVar2->h_,0,(ulong)uVar3 << 0x20);
  }
  return;
}

Assistant:

void Fl_Widget::draw_backdrop() const {
  if (align() & FL_ALIGN_IMAGE_BACKDROP) {
    const Fl_Image *img = image();
    // if there is no image, we will not draw the deimage either
    if (img && deimage() && !active_r())
      img = deimage();
    if (img)
      ((Fl_Image*)img)->draw(x_+(w_-img->w())/2, y_+(h_-img->h())/2);
  }
}